

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD5Importer::MakeDataUnique(MD5Importer *this,MeshDesc *meshSrc)

{
  uint uVar1;
  pointer pVVar2;
  pointer pVVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  DeadlyImportError *this_00;
  long lVar7;
  ulong uVar8;
  pointer paVar9;
  reference rVar10;
  allocator_type local_81;
  pointer local_80;
  string local_78;
  vector<bool,_std::allocator<bool>_> abHad;
  
  local_78._M_dataplus._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&abHad,(long)(meshSrc->mVertices).
                          super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(meshSrc->mVertices).
                          super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4,(bool *)&local_78,&local_81
            );
  pVVar2 = (meshSrc->mVertices).
           super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (ulong)(uint)((int)((ulong)((long)(meshSrc->mFaces).
                                            super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(meshSrc->mFaces).
                                           super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 4) * 3);
  pVVar3 = (meshSrc->mVertices).
           super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::resize
            (&meshSrc->mVertices,uVar6);
  uVar8 = (ulong)((long)pVVar2 - (long)pVVar3) >> 4;
  uVar6 = (ulong)((float)uVar6 *
                 ((float)(ulong)(((long)(meshSrc->mWeights).
                                        super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(meshSrc->mWeights).
                                       super__Vector_base<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x14) /
                 (float)(uVar8 & 0xffffffff)));
  std::vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>::reserve
            (&meshSrc->mWeights,(ulong)(((uint)(uVar6 >> 3) & 0x1fffffff) + (int)uVar6));
  paVar9 = (meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_80 = (meshSrc->mFaces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    if (paVar9 == local_80) {
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&abHad.super__Bvector_base<std::allocator<bool>_>);
      return;
    }
    for (lVar7 = 0; puVar4 = paVar9->mIndices, lVar7 != 3; lVar7 = lVar7 + 1) {
      if ((ulong)((long)(meshSrc->mVertices).
                        super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(meshSrc->mVertices).
                        super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)*puVar4) {
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"MD5MESH: Invalid vertex index",(allocator<char> *)&local_81)
        ;
        DeadlyImportError::DeadlyImportError(this_00,&local_78);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&abHad,(ulong)puVar4[lVar7]);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) {
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&abHad,(ulong)paVar9->mIndices[lVar7]);
        *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
      }
      else {
        pVVar3 = (meshSrc->mVertices).
                 super__Vector_base<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar2 = pVVar3 + paVar9->mIndices[lVar7];
        uVar1 = pVVar2->mFirstWeight;
        uVar5 = pVVar2->mNumWeights;
        pVVar3 = pVVar3 + (uVar8 & 0xffffffff);
        pVVar3->mUV = pVVar2->mUV;
        pVVar3->mFirstWeight = uVar1;
        pVVar3->mNumWeights = uVar5;
        paVar9->mIndices[lVar7] = (uint)uVar8;
        uVar8 = (ulong)((uint)uVar8 + 1);
      }
    }
    uVar1 = *puVar4;
    *puVar4 = puVar4[2];
    puVar4[2] = uVar1;
    paVar9 = paVar9 + 1;
  } while( true );
}

Assistant:

void MD5Importer::MakeDataUnique (MD5::MeshDesc& meshSrc)
{
    std::vector<bool> abHad(meshSrc.mVertices.size(),false);

    // allocate enough storage to keep the output structures
    const unsigned int iNewNum = static_cast<unsigned int>(meshSrc.mFaces.size()*3);
    unsigned int iNewIndex = static_cast<unsigned int>(meshSrc.mVertices.size());
    meshSrc.mVertices.resize(iNewNum);

    // try to guess how much storage we'll need for new weights
    const float fWeightsPerVert = meshSrc.mWeights.size() / (float)iNewIndex;
    const unsigned int guess = (unsigned int)(fWeightsPerVert*iNewNum);
    meshSrc.mWeights.reserve(guess + (guess >> 3)); // + 12.5% as buffer

    for (FaceList::const_iterator iter = meshSrc.mFaces.begin(),iterEnd = meshSrc.mFaces.end();iter != iterEnd;++iter){
        const aiFace& face = *iter;
        for (unsigned int i = 0; i < 3;++i) {
            if (face.mIndices[0] >= meshSrc.mVertices.size()) {
                throw DeadlyImportError("MD5MESH: Invalid vertex index");
            }

            if (abHad[face.mIndices[i]])    {
                // generate a new vertex
                meshSrc.mVertices[iNewIndex] = meshSrc.mVertices[face.mIndices[i]];
                face.mIndices[i] = iNewIndex++;
            }
            else abHad[face.mIndices[i]] = true;
        }
        // swap face order
        std::swap(face.mIndices[0],face.mIndices[2]);
    }
}